

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_c91b1::GetLoadStoreInfo
                    (VmModule *module,VmValue *loadPointer,VmConstant *loadOffset,uint loadSize,
                    uint accessSize,VmInstructionType loadCmd)

{
  bool bVar1;
  uint uVar2;
  VmConstant *rhs;
  LoadStoreInfo *pLVar3;
  VmValue **ppVVar4;
  VmValue *pVVar5;
  LoadStoreInfo *el_1;
  uint i_1;
  VmValue *constant;
  VmValue *component;
  VmValue *value;
  LoadStoreInfo *el;
  uint i;
  VmConstant *loadAddress;
  VmInstructionType loadCmd_local;
  uint accessSize_local;
  uint loadSize_local;
  VmConstant *loadOffset_local;
  VmValue *loadPointer_local;
  VmModule *module_local;
  
  rhs = getType<VmConstant>(loadPointer);
  if (rhs == (VmConstant *)0x0) {
    for (el_1._4_4_ = 0;
        uVar2 = SmallArray<VmModule::LoadStoreInfo,_32U>::size(&module->loadStoreInfo),
        el_1._4_4_ < uVar2; el_1._4_4_ = el_1._4_4_ + 1) {
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[]
                         (&module->loadStoreInfo,el_1._4_4_);
      if ((((pLVar3->loadInst != (VmInstruction *)0x0) && (pLVar3->loadPointer != (VmValue *)0x0))
          && (pLVar3->loadPointer == loadPointer)) &&
         ((pLVar3->loadOffset->iValue == loadOffset->iValue && (accessSize == pLVar3->accessSize))))
      {
        if (pLVar3->loadInst->parent != (VmBlock *)0x0) {
          return &pLVar3->loadInst->super_VmValue;
        }
        __assert_fail("el.loadInst->parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x6c7,
                      "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                     );
      }
    }
  }
  else {
    if (rhs->container == (VariableData *)0x0) {
      return (VmValue *)0x0;
    }
    if (loadOffset->iValue != 0) {
      __assert_fail("loadOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x692,
                    "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                   );
    }
    for (el._4_4_ = 0;
        uVar2 = SmallArray<VmModule::LoadStoreInfo,_32U>::size(&module->loadStoreInfo),
        el._4_4_ < uVar2; el._4_4_ = el._4_4_ + 1) {
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,el._4_4_)
      ;
      if (((pLVar3->loadInst != (VmInstruction *)0x0) && (pLVar3->loadAddress != (VmConstant *)0x0))
         && ((bVar1 = VmConstant::operator==(pLVar3->loadAddress,rhs), bVar1 &&
             (accessSize == pLVar3->accessSize)))) {
        if (pLVar3->loadInst->parent != (VmBlock *)0x0) {
          return &pLVar3->loadInst->super_VmValue;
        }
        __assert_fail("el.loadInst->parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x69d,
                      "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                     );
      }
      if ((pLVar3->storeInst != (VmInstruction *)0x0) && (pLVar3->storeAddress != (VmConstant *)0x0)
         ) {
        bVar1 = VmConstant::operator==(pLVar3->storeAddress,rhs);
        if ((bVar1) && (accessSize == pLVar3->accessSize)) {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pLVar3->storeInst->arguments,2);
          if (((*ppVVar4)->type).size == loadSize) {
            return *ppVVar4;
          }
          return (VmValue *)0x0;
        }
        if ((pLVar3->storeAddress->container == rhs->container) &&
           (accessSize <= pLVar3->accessSize)) {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pLVar3->storeInst->arguments,2);
          pVVar5 = TryExtractConstructElement
                             (*ppVVar4,pLVar3->storeAddress->iValue,rhs->iValue,accessSize);
          if (pVVar5 != (VmValue *)0x0) {
            return pVVar5;
          }
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pLVar3->storeInst->arguments,2);
          pVVar5 = TryExtractConstant(module,*ppVVar4,pLVar3->storeAddress->iValue,
                                      pLVar3->accessSize,rhs->iValue,accessSize,loadCmd);
          if (pVVar5 != (VmValue *)0x0) {
            return pVVar5;
          }
        }
      }
    }
  }
  return (VmValue *)0x0;
}

Assistant:

VmValue* GetLoadStoreInfo(VmModule *module, VmValue *loadPointer, VmConstant *loadOffset, unsigned loadSize, unsigned accessSize, VmInstructionType loadCmd)
	{
		if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
		{
			if(!loadAddress->container)
				return NULL;

			assert(loadOffset->iValue == 0);

			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				// Reuse previous load
				if(el.loadInst && el.loadAddress)
				{
					if(*el.loadAddress == *loadAddress && accessSize == el.accessSize)
					{
						assert(el.loadInst->parent);

						return el.loadInst;
					}
				}

				// Reuse store argument
				if(el.storeInst && el.storeAddress)
				{
					if(*el.storeAddress == *loadAddress && accessSize == el.accessSize)
					{
						VmValue *value = el.storeInst->arguments[2];

						// Can't reuse arguments of a different size
						if(value->type.size != loadSize)
							return NULL;

						return value;
					}

					if(el.storeAddress->container == loadAddress->container && accessSize <= el.accessSize)
					{
						if(VmValue *component = TryExtractConstructElement(el.storeInst->arguments[2], el.storeAddress->iValue, loadAddress->iValue, accessSize))
							return component;

						if(VmValue *constant = TryExtractConstant(module, el.storeInst->arguments[2], el.storeAddress->iValue, el.accessSize, loadAddress->iValue, accessSize, loadCmd))
							return constant;
					}
				}
			}
		}
		else
		{
			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				// Reuse previous load
				if(el.loadInst && el.loadPointer)
				{
					if(el.loadPointer == loadPointer && el.loadOffset->iValue == loadOffset->iValue && accessSize == el.accessSize)
					{
						assert(el.loadInst->parent);

						return el.loadInst;
					}
				}
			}
		}

		return NULL;
	}